

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseNmtoken(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  uint uVar8;
  uint uVar9;
  int l;
  xmlChar buf [105];
  int local_b0;
  int local_ac;
  xmlChar local_a8 [120];
  
  local_ac = 10000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    local_ac = 50000;
  }
  iVar3 = xmlCurrentChar(ctxt,&local_b0);
  uVar9 = 0;
  do {
    iVar4 = xmlIsNameChar(ctxt,iVar3);
    if (iVar4 == 0) {
      if (uVar9 != 0) {
        pxVar6 = xmlStrndup(local_a8,uVar9);
        if (pxVar6 != (xmlChar *)0x0) {
          return pxVar6;
        }
        xmlCtxtErrMemory(ctxt);
        return (xmlChar *)0x0;
      }
      goto LAB_0013143c;
    }
    if (iVar3 < 0x80) {
      uVar8 = uVar9 + 1;
      local_a8[(int)uVar9] = (xmlChar)iVar3;
    }
    else {
      iVar3 = xmlCopyCharMultiByte(local_a8 + (int)uVar9,iVar3);
      uVar8 = uVar9 + iVar3;
    }
    pxVar1 = ctxt->input;
    if (*pxVar1->cur == '\n') {
      pxVar1->line = pxVar1->line + 1;
      pxVar1->col = 1;
    }
    else {
      pxVar1->col = pxVar1->col + 1;
    }
    pxVar1->cur = pxVar1->cur + local_b0;
    iVar3 = xmlCurrentChar(ctxt,&local_b0);
    uVar9 = uVar8;
  } while ((int)uVar8 < 100);
  iVar4 = uVar8 * 2;
  pxVar6 = (xmlChar *)(*xmlMalloc)((size_t)iVar4);
  if (pxVar6 == (xmlChar *)0x0) {
    xmlCtxtErrMemory(ctxt);
LAB_0013143c:
    pxVar6 = (xmlChar *)0x0;
  }
  else {
    memcpy(pxVar6,local_a8,(ulong)uVar8);
    iVar5 = xmlIsNameChar(ctxt,iVar3);
    while (iVar5 != 0) {
      if (iVar4 < (int)(uVar8 + 10)) {
        iVar5 = 1;
        if (((0 < iVar4) && (iVar5 = -1, iVar4 < local_ac)) &&
           (uVar9 = iVar4 + 1U >> 1, iVar5 = uVar9 + iVar4, (int)(local_ac - uVar9) < iVar4)) {
          iVar5 = local_ac;
        }
        if (iVar5 < 0) {
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NmToken");
LAB_00131383:
          (*xmlFree)(pxVar6);
          bVar2 = false;
        }
        else {
          pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,(size_t)iVar5);
          if (pxVar7 == (xmlChar *)0x0) {
            xmlCtxtErrMemory(ctxt);
            goto LAB_00131383;
          }
          bVar2 = true;
          pxVar6 = pxVar7;
          iVar4 = iVar5;
        }
        if (!bVar2) goto LAB_0013143c;
      }
      if (iVar3 < 0x80) {
        uVar9 = uVar8 + 1;
        pxVar6[(int)uVar8] = (xmlChar)iVar3;
      }
      else {
        iVar3 = xmlCopyCharMultiByte(pxVar6 + (int)uVar8,iVar3);
        uVar9 = iVar3 + uVar8;
      }
      pxVar1 = ctxt->input;
      if (*pxVar1->cur == '\n') {
        pxVar1->line = pxVar1->line + 1;
        pxVar1->col = 1;
      }
      else {
        pxVar1->col = pxVar1->col + 1;
      }
      pxVar1->cur = pxVar1->cur + local_b0;
      iVar3 = xmlCurrentChar(ctxt,&local_b0);
      iVar5 = xmlIsNameChar(ctxt,iVar3);
      uVar8 = uVar9;
    }
    pxVar6[(int)uVar8] = '\0';
  }
  return pxVar6;
}

Assistant:

xmlChar *
xmlParseNmtoken(xmlParserCtxtPtr ctxt) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *ret;
    int len = 0, l;
    int c;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;

    c = xmlCurrentChar(ctxt, &l);

    while (xmlIsNameChar(ctxt, c)) {
	COPY_BUF(buf, len, c);
	NEXTL(l);
	c = xmlCurrentChar(ctxt, &l);
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge token, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (len + 10 > max) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, maxLength);
                    if (newSize < 0) {
                        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
                        xmlFree(buffer);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
                    max = newSize;
		}
		COPY_BUF(buffer, len, c);
		NEXTL(l);
		c = xmlCurrentChar(ctxt, &l);
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
        return(NULL);
    if (len > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
        return(NULL);
    }
    ret = xmlStrndup(buf, len);
    if (ret == NULL)
        xmlErrMemory(ctxt);
    return(ret);
}